

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

void applySeasonalMean(double *x,int N,int *cycle,int f)

{
  void *__ptr;
  void *__ptr_00;
  int *cval;
  double *seasonal_means;
  int i;
  int f_local;
  int *cycle_local;
  int N_local;
  double *x_local;
  
  __ptr = calloc((long)f,(long)f << 3);
  __ptr_00 = calloc((long)f,(long)f << 2);
  for (seasonal_means._0_4_ = 0; (int)seasonal_means < N;
      seasonal_means._0_4_ = (int)seasonal_means + 1) {
    *(int *)((long)__ptr_00 + (long)cycle[(int)seasonal_means] * 4) =
         *(int *)((long)__ptr_00 + (long)cycle[(int)seasonal_means] * 4) + 1;
    *(double *)((long)__ptr + (long)cycle[(int)seasonal_means] * 8) =
         x[(int)seasonal_means] + *(double *)((long)__ptr + (long)cycle[(int)seasonal_means] * 8);
  }
  for (seasonal_means._0_4_ = 0; (int)seasonal_means < f;
      seasonal_means._0_4_ = (int)seasonal_means + 1) {
    *(double *)((long)__ptr + (long)(int)seasonal_means * 8) =
         *(double *)((long)__ptr + (long)(int)seasonal_means * 8) /
         (double)*(int *)((long)__ptr_00 + (long)(int)seasonal_means * 4);
  }
  for (seasonal_means._0_4_ = 0; (int)seasonal_means < N;
      seasonal_means._0_4_ = (int)seasonal_means + 1) {
    x[(int)seasonal_means] = *(double *)((long)__ptr + (long)cycle[(int)seasonal_means] * 8);
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

static void applySeasonalMean(double *x,int N,int *cycle,int f) {
    int i;
    double *seasonal_means;
    int *cval;

    seasonal_means = (double*)calloc(f,sizeof(double)*f);
    cval = (int*)calloc(f,sizeof(int)*f);

    for(i = 0; i < N;++i) {
        cval[cycle[i]] += 1;
        seasonal_means[cycle[i]] += x[i];
    }

    for(i = 0; i < f;++i) {
        seasonal_means[i] /= (double) cval[i];
    }

    for(i = 0; i < N;++i) {
        x[i] = seasonal_means[cycle[i]];
    }

    free(seasonal_means);
    free(cval);
}